

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStep_ComputeSolutions_MassFixed(ARKodeMem ark_mem,sunrealtype *dsmPtr)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  N_Vector p_Var4;
  N_Vector p_Var5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  bool bVar11;
  sunrealtype sVar12;
  
  pvVar3 = ark_mem->step_mem;
  if (pvVar3 == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xbe4,"arkStep_ComputeSolutions_MassFixed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
    return -0x15;
  }
  p_Var4 = ark_mem->ycur;
  p_Var5 = ark_mem->tempv1;
  lVar6 = *(long *)((long)pvVar3 + 0x1a8);
  lVar7 = *(long *)((long)pvVar3 + 0x1b0);
  *dsmPtr = 0.0;
  if (*(int *)((long)pvVar3 + 0x1c) == 0) {
    bVar11 = true;
  }
  else {
    iVar8 = ARKodeButcherTable_IsStifflyAccurate(*(ARKodeButcherTable *)((long)pvVar3 + 0x68));
    bVar11 = iVar8 != 0;
  }
  if ((*(int *)((long)pvVar3 + 0x20) != 0) &&
     (iVar8 = ARKodeButcherTable_IsStifflyAccurate(*(ARKodeButcherTable *)((long)pvVar3 + 0x70)),
     iVar8 == 0)) {
    bVar11 = false;
  }
  if (!bVar11) {
    iVar8 = *(int *)((long)pvVar3 + 100);
    if ((long)iVar8 < 1) {
      iVar10 = 0;
    }
    else {
      iVar1 = *(int *)((long)pvVar3 + 0x1c);
      iVar2 = *(int *)((long)pvVar3 + 0x20);
      lVar9 = 0;
      iVar10 = 0;
      do {
        if (iVar1 != 0) {
          *(double *)(lVar6 + (long)iVar10 * 8) =
               ark_mem->h *
               *(double *)(*(long *)(*(long *)((long)pvVar3 + 0x68) + 0x20) + lVar9 * 8);
          *(undefined8 *)(lVar7 + (long)iVar10 * 8) =
               *(undefined8 *)(*(long *)((long)pvVar3 + 0x28) + lVar9 * 8);
          iVar10 = iVar10 + 1;
        }
        if (iVar2 != 0) {
          *(double *)(lVar6 + (long)iVar10 * 8) =
               ark_mem->h *
               *(double *)(*(long *)(*(long *)((long)pvVar3 + 0x70) + 0x20) + lVar9 * 8);
          *(undefined8 *)(lVar7 + (long)iVar10 * 8) =
               *(undefined8 *)(*(long *)((long)pvVar3 + 0x30) + lVar9 * 8);
          iVar10 = iVar10 + 1;
        }
        lVar9 = lVar9 + 1;
      } while (iVar8 != lVar9);
    }
    iVar8 = N_VLinearCombination(iVar10,lVar6,lVar7,p_Var4);
    if (iVar8 != 0) {
      return -0x1c;
    }
    iVar8 = (**(code **)((long)pvVar3 + 0x160))(*(undefined8 *)((long)pvVar3 + 0xe8),ark_mem,p_Var4)
    ;
    if (iVar8 < 0) {
      *dsmPtr = 2.0;
      N_VScale(0x3ff0000000000000,ark_mem->yn,p_Var4);
      return 4;
    }
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,ark_mem->yn,p_Var4,p_Var4);
  }
  if (ark_mem->fixedstep != 0) {
    return 0;
  }
  iVar8 = *(int *)((long)pvVar3 + 100);
  if ((long)iVar8 < 1) {
    iVar10 = 0;
  }
  else {
    iVar1 = *(int *)((long)pvVar3 + 0x1c);
    iVar2 = *(int *)((long)pvVar3 + 0x20);
    lVar9 = 0;
    iVar10 = 0;
    do {
      if (iVar1 != 0) {
        *(double *)(lVar6 + (long)iVar10 * 8) =
             (*(double *)(*(long *)(*(long *)((long)pvVar3 + 0x68) + 0x20) + lVar9 * 8) -
             *(double *)(*(long *)(*(long *)((long)pvVar3 + 0x68) + 0x28) + lVar9 * 8)) * ark_mem->h
        ;
        *(undefined8 *)(lVar7 + (long)iVar10 * 8) =
             *(undefined8 *)(*(long *)((long)pvVar3 + 0x28) + lVar9 * 8);
        iVar10 = iVar10 + 1;
      }
      if (iVar2 != 0) {
        *(double *)(lVar6 + (long)iVar10 * 8) =
             (*(double *)(*(long *)(*(long *)((long)pvVar3 + 0x70) + 0x20) + lVar9 * 8) -
             *(double *)(*(long *)(*(long *)((long)pvVar3 + 0x70) + 0x28) + lVar9 * 8)) * ark_mem->h
        ;
        *(undefined8 *)(lVar7 + (long)iVar10 * 8) =
             *(undefined8 *)(*(long *)((long)pvVar3 + 0x30) + lVar9 * 8);
        iVar10 = iVar10 + 1;
      }
      lVar9 = lVar9 + 1;
    } while (iVar8 != lVar9);
  }
  iVar8 = N_VLinearCombination(iVar10,lVar6,lVar7,p_Var5);
  if (iVar8 == 0) {
    iVar8 = (**(code **)((long)pvVar3 + 0x160))(*(undefined8 *)((long)pvVar3 + 0xe8),ark_mem,p_Var5)
    ;
    if (iVar8 < 0) {
      *dsmPtr = 2.0;
      return 4;
    }
    sVar12 = (sunrealtype)N_VWrmsNorm(p_Var5,ark_mem->ewt);
    *dsmPtr = sVar12;
    return 0;
  }
  return -0x1c;
}

Assistant:

int arkStep_ComputeSolutions_MassFixed(ARKodeMem ark_mem, sunrealtype* dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  sunbooleantype stiffly_accurate;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* set N_Vector shortcuts, and shortcut to time at end of step */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* check if the method is stiffly accurate */
  stiffly_accurate = SUNTRUE;

  if (step_mem->explicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Be))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  if (step_mem->implicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  /* If the method is stiffly accurate, ycur is already the new solution */

  if (!stiffly_accurate)
  {
    /* compute y RHS (store in y) */
    /*   set arrays for fused vector operation */
    nvec = 0;
    for (j = 0; j < step_mem->stages; j++)
    {
      if (step_mem->explicit)
      { /* Explicit pieces */
        cvals[nvec] = ark_mem->h * step_mem->Be->b[j];
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit)
      { /* Implicit pieces */
        cvals[nvec] = ark_mem->h * step_mem->Bi->b[j];
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /*   call fused vector operation to compute RHS */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }

    /* solve for y update (stored in y) */
    retval = step_mem->msolve((void*)ark_mem, y, step_mem->nlscoef);
    if (retval < 0)
    {
      *dsmPtr = SUN_RCONST(2.0); /* indicate too much error, step with smaller step */
      N_VScale(ONE, ark_mem->yn, y); /* place old solution into y */
      return (CONV_FAIL);
    }

    /* compute y = yn + update */
    N_VLinearSum(ONE, ark_mem->yn, ONE, y, y);
  }

  /* compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep)
  {
    /* compute yerr RHS vector */
    /*   set arrays for fused vector operation */
    nvec = 0;
    for (j = 0; j < step_mem->stages; j++)
    {
      if (step_mem->explicit)
      { /* Explicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Be->b[j] - step_mem->Be->d[j]);
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit)
      { /* Implicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Bi->b[j] - step_mem->Bi->d[j]);
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /*   call fused vector operation to compute yerr RHS */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }

    /* solve for yerr */
    retval = step_mem->msolve((void*)ark_mem, yerr, step_mem->nlscoef);
    if (retval < 0)
    {
      *dsmPtr = SUN_RCONST(2.0); /* next attempt will reduce step by 'etacf';
                                 insert dsmPtr placeholder here */
      return (CONV_FAIL);
    }
    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return (ARK_SUCCESS);
}